

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::IsVisibleToPlayer(AActor *this)

{
  DWORD DVar1;
  player_t *ppVar2;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  PClass *pPVar6;
  PClass *ti;
  uint i;
  ulong uVar7;
  bool bVar8;
  
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
  bVar8 = true;
  if (pAVar5 != (AActor *)0x0) {
    DVar1 = this->VisibleToTeam;
    if (((DVar1 != 0) && (teamplay.Value == true)) &&
       (iVar4 = userinfo_t::GetTeam((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0)),
       DVar1 - 1 != iVar4)) {
      return false;
    }
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    ppVar2 = pAVar5->player;
    if (((ppVar2 != (player_t *)0x0) && (ppVar2->mo != (APlayerPawn *)0x0)) &&
       (pPVar6 = DObject::GetClass((DObject *)this),
       *(int *)((long)&pPVar6[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.Symbols.Symbols + 0xc) != 0)) {
      uVar7 = 0;
      while( true ) {
        pPVar6 = DObject::GetClass((DObject *)this);
        bVar8 = uVar7 < *(uint *)((long)&pPVar6[1].super_PNativeStruct.super_PStruct.
                                         super_PNamedType.super_PCompoundType.super_PType.Symbols.
                                         Symbols + 0xc);
        if (!bVar8) break;
        pPVar6 = DObject::GetClass((DObject *)this);
        pPVar6 = (PClass *)
                 (&(pPVar6[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType
                    .super_PType.Symbols.Symbols.Nodes)->Next)[uVar7];
        if (pPVar6 != (PClass *)0x0) {
          ti = DObject::GetClass((DObject *)ppVar2->mo);
          bVar3 = PClass::IsAncestorOf(pPVar6,ti);
          if (bVar3) {
            return bVar8;
          }
        }
        uVar7 = uVar7 + 1;
      }
    }
  }
  return bVar8;
}

Assistant:

bool AActor::IsVisibleToPlayer() const
{
	// [BB] Safety check. This should never be NULL. Nevertheless, we return true to leave the default ZDoom behavior unaltered.
	if ( players[consoleplayer].camera == NULL )
		return true;
 
	if (VisibleToTeam != 0 && teamplay &&
		(signed)(VisibleToTeam-1) != players[consoleplayer].userinfo.GetTeam() )
		return false;

	const player_t* pPlayer = players[consoleplayer].camera->player;

	if (pPlayer && pPlayer->mo && GetClass()->VisibleToPlayerClass.Size() > 0)
	{
		bool visible = false;
		for(unsigned int i = 0;i < GetClass()->VisibleToPlayerClass.Size();++i)
		{
			PClassPlayerPawn *cls = GetClass()->VisibleToPlayerClass[i];
			if (cls && pPlayer->mo->GetClass()->IsDescendantOf(cls))
			{
				visible = true;
				break;
			}
		}
		if (!visible)
			return false;
	}

	// [BB] Passed all checks.
	return true;
}